

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void tinyexr::CompressZip
               (uchar *dst,tinyexr_uint64 *compressedSize,uchar *src,unsigned_long src_size)

{
  value_type vVar1;
  char cVar2;
  int iVar3;
  reference pvVar4;
  mz_ulong mVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  ulong in_RCX;
  value_type *pvVar6;
  value_type *in_RDX;
  ulong *in_RSI;
  mz_ulong *in_RDI;
  int ret;
  mz_ulong outSize;
  int d;
  int p;
  uchar *stop_1;
  uchar *t;
  char *stop;
  char *t2;
  char *t1;
  char *srcPtr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpBuf;
  mz_ulong in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  mz_ulong *pDest_len;
  allocator_type *in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff40;
  value_type *local_78;
  value_type *local_68;
  reference local_60;
  value_type *local_58;
  
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x17b526);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x17b54c);
  local_60 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff18);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      in_stack_ffffffffffffff18);
  local_68 = pvVar4 + (in_RCX + 1 >> 1);
  local_58 = in_RDX;
  while (local_58 < in_RDX + in_RCX) {
    pvVar6 = local_58 + 1;
    *local_60 = *local_58;
    if (in_RDX + in_RCX <= pvVar6) break;
    local_58 = local_58 + 2;
    *local_68 = *pvVar6;
    local_68 = local_68 + 1;
    local_60 = local_60 + 1;
  }
  local_78 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff18);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      in_stack_ffffffffffffff18);
  vVar1 = *local_78;
  while (local_78 = local_78 + 1, local_78 < pvVar4 + in_RCX) {
    cVar2 = *local_78 - vVar1;
    vVar1 = *local_78;
    *local_78 = cVar2 + 0x80;
  }
  mVar5 = mz_compressBound(0x17b75f);
  pDest_len = in_RDI;
  this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                    in_stack_ffffffffffffff18);
  iVar3 = mz_compress((uchar *)this,pDest_len,
                      (uchar *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      in_stack_ffffffffffffff18);
  if (iVar3 != 0) {
    __assert_fail("ret == miniz::MZ_OK",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/ThirdParty/tinyexr.h"
                  ,0x1d9c,
                  "void tinyexr::CompressZip(unsigned char *, tinyexr::tinyexr_uint64 &, const unsigned char *, unsigned long)"
                 );
  }
  *in_RSI = mVar5;
  if (in_RCX <= *in_RSI) {
    *in_RSI = in_RCX;
    memcpy(in_RDI,in_RDX,in_RCX);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this);
  return;
}

Assistant:

static void CompressZip(unsigned char *dst,
                        tinyexr::tinyexr_uint64 &compressedSize,
                        const unsigned char *src, unsigned long src_size) {
  std::vector<unsigned char> tmpBuf(src_size);

  //
  // Apply EXR-specific? postprocess. Grabbed from OpenEXR's
  // ImfZipCompressor.cpp
  //

  //
  // Reorder the pixel data.
  //

  const char *srcPtr = reinterpret_cast<const char *>(src);

  {
    char *t1 = reinterpret_cast<char *>(&tmpBuf.at(0));
    char *t2 = reinterpret_cast<char *>(&tmpBuf.at(0)) + (src_size + 1) / 2;
    const char *stop = srcPtr + src_size;

    for (;;) {
      if (srcPtr < stop)
        *(t1++) = *(srcPtr++);
      else
        break;

      if (srcPtr < stop)
        *(t2++) = *(srcPtr++);
      else
        break;
    }
  }

  //
  // Predictor.
  //

  {
    unsigned char *t = &tmpBuf.at(0) + 1;
    unsigned char *stop = &tmpBuf.at(0) + src_size;
    int p = t[-1];

    while (t < stop) {
      int d = int(t[0]) - p + (128 + 256);
      p = t[0];
      t[0] = static_cast<unsigned char>(d);
      ++t;
    }
  }

#if TINYEXR_USE_MINIZ
  //
  // Compress the data using miniz
  //

  miniz::mz_ulong outSize = miniz::mz_compressBound(src_size);
  int ret = miniz::mz_compress(
      dst, &outSize, static_cast<const unsigned char *>(&tmpBuf.at(0)),
      src_size);
  TEXR_ASSERT(ret == miniz::MZ_OK);
  (void)ret;

  compressedSize = outSize;
#else
  uLong outSize = compressBound(static_cast<uLong>(src_size));
  int ret = compress(dst, &outSize, static_cast<const Bytef *>(&tmpBuf.at(0)),
                     src_size);
  TEXR_ASSERT(ret == Z_OK);

  compressedSize = outSize;
#endif

  // Use uncompressed data when compressed data is larger than uncompressed.
  // (Issue 40)
  if (compressedSize >= src_size) {
    compressedSize = src_size;
    memcpy(dst, src, src_size);
  }
}